

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writeincludesbase.cpp
# Opt level: O2

void __thiscall
WriteIncludesBase::add(WriteIncludesBase *this,QString *className,DomCustomWidget *dcw)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  CustomWidgetsInfo *this_00;
  long lVar4;
  long in_FS_OFFSET;
  QAnyStringView baseClassName;
  QAnyStringView baseClassName_00;
  initializer_list<QString> args;
  QArrayDataPointer<char16_t> local_f8;
  QArrayDataPointer<char16_t> local_e0;
  QArrayDataPointer<char16_t> local_c8;
  QArrayDataPointer<char16_t> local_b0;
  QArrayDataPointer<char16_t> local_98;
  undefined8 local_80;
  char16_t *local_78;
  undefined8 local_70;
  undefined8 local_68;
  char16_t *local_60;
  undefined8 local_58;
  undefined8 local_50;
  char16_t *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((className->d).size != 0) {
    bVar1 = QHash<QString,_QHashDummyValue>::contains(&(this->m_knownClasses).q_hash,className);
    if (!bVar1) {
      QSet<QString>::insert((QSet<QString> *)&local_98,(QString *)&this->m_knownClasses);
      this_00 = &this->m_uic->cWidgetsInfo;
      if (add(QString_const&,DomCustomWidget_const*)::treeViewsWithHeaders == '\0') {
        iVar2 = __cxa_guard_acquire(&add(QString_const&,DomCustomWidget_const*)::
                                     treeViewsWithHeaders);
        if (iVar2 != 0) {
          local_b0.d = (Data *)0x0;
          local_b0.ptr = (char16_t *)0x0;
          local_98.d = (Data *)0x0;
          local_98.ptr = L"QTreeView";
          local_b0.size = 0;
          local_98.size = 9;
          local_80 = 0;
          local_c8.d = (Data *)0x0;
          local_c8.ptr = (char16_t *)0x0;
          local_c8.size = 0;
          local_78 = L"QTreeWidget";
          local_70 = 0xb;
          local_e0.d = (Data *)0x0;
          local_e0.ptr = (char16_t *)0x0;
          local_68 = 0;
          local_60 = L"QTableView";
          local_e0.size = 0;
          local_58 = 10;
          local_50 = 0;
          local_f8.d = (Data *)0x0;
          local_f8.ptr = (char16_t *)0x0;
          local_48 = L"QTableWidget";
          local_f8.size = 0;
          local_40 = 0xc;
          args._M_len = 4;
          args._M_array = (iterator)&local_98;
          QList<QString>::QList(&add::treeViewsWithHeaders,args);
          lVar4 = 0x48;
          do {
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)((long)&local_98.d + lVar4));
            lVar4 = lVar4 + -0x18;
          } while (lVar4 != -0x18);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e0);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
          __cxa_atexit(QList<QString>::~QList,&add::treeViewsWithHeaders,&__dso_handle);
          __cxa_guard_release(&add(QString_const&,DomCustomWidget_const*)::treeViewsWithHeaders);
        }
      }
      bVar1 = CustomWidgetsInfo::extendsOneOf(this_00,className,&add::treeViewsWithHeaders);
      if (bVar1) {
        local_98.d = (Data *)0x0;
        local_b0.d = (Data *)0x0;
        local_b0.ptr = (char16_t *)0x0;
        local_98.ptr = L"QHeaderView";
        local_b0.size = 0;
        local_98.size = 0xb;
        add(this,(QString *)&local_98,(DomCustomWidget *)0x0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
      }
      if (this->m_laidOut == false) {
        sVar3 = QtPrivate::lengthHelperContainer<char,9ul>((char (*) [9])"QToolBox");
        baseClassName.m_size = sVar3;
        baseClassName.field_0.m_data_utf8 = "QToolBox";
        bVar1 = CustomWidgetsInfo::extends(this_00,className,baseClassName);
        if (bVar1) {
          local_98.d = (Data *)0x0;
          local_b0.d = (Data *)0x0;
          local_b0.ptr = (char16_t *)0x0;
          local_98.ptr = L"QLayout";
          local_b0.size = 0;
          local_98.size = 7;
          add(this,(QString *)&local_98,(DomCustomWidget *)0x0);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
        }
      }
      local_98.d = (Data *)0x0;
      local_b0.d = (Data *)0x0;
      local_b0.ptr = (char16_t *)0x0;
      local_98.ptr = L"Line";
      local_b0.size = 0;
      local_98.size = 4;
      bVar1 = comparesEqual(className,(QString *)&local_98);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
      if (bVar1) {
        local_98.d = (Data *)0x0;
        local_b0.d = (Data *)0x0;
        local_b0.ptr = (char16_t *)0x0;
        local_98.ptr = L"QFrame";
        local_b0.size = 0;
        local_98.size = 6;
        add(this,(QString *)&local_98,(DomCustomWidget *)0x0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
      }
      else {
        sVar3 = QtPrivate::lengthHelperContainer<char,17ul>((char (*) [17])"QDialogButtonBox");
        baseClassName_00.m_size = sVar3;
        baseClassName_00.field_0.m_data_utf8 = "QDialogButtonBox";
        bVar1 = CustomWidgetsInfo::extends(this_00,className,baseClassName_00);
        if (bVar1) {
          local_98.d = (Data *)0x0;
          local_b0.d = (Data *)0x0;
          local_b0.ptr = (char16_t *)0x0;
          local_98.ptr = L"QAbstractButton";
          local_b0.size = 0;
          local_98.size = 0xf;
          add(this,(QString *)&local_98,(DomCustomWidget *)0x0);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
        }
        (*(this->super_TreeWalker)._vptr_TreeWalker[0x23])(this,className,dcw);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteIncludesBase::add(const QString &className, const DomCustomWidget *dcw)
{
    if (className.isEmpty() || m_knownClasses.contains(className))
        return;

    m_knownClasses.insert(className);

    const CustomWidgetsInfo *cwi = m_uic->customWidgetsInfo();
    static const QStringList treeViewsWithHeaders = {
        QStringLiteral("QTreeView"), QStringLiteral("QTreeWidget"),
        QStringLiteral("QTableView"), QStringLiteral("QTableWidget")
    };
    if (cwi->extendsOneOf(className, treeViewsWithHeaders))
        add(QStringLiteral("QHeaderView"));

    if (!m_laidOut && cwi->extends(className, "QToolBox"))
        add(QStringLiteral("QLayout")); // spacing property of QToolBox)

    if (className == QStringLiteral("Line")) { // ### hmm, deprecate me!
        add(QStringLiteral("QFrame"));
        return;
    }

    if (cwi->extends(className, "QDialogButtonBox"))
        add(QStringLiteral("QAbstractButton")); // for signal "clicked(QAbstractButton*)"

    doAdd(className, dcw);
}